

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

void mocker::ir::verifyFuncModule(FunctionModule *func)

{
  BasicBlockList *pBVar1;
  long lVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  key_type *__k;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  _List_node_base *p_Var12;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Reg> dest;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defined;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  shared_ptr<mocker::ir::Addr> local_90;
  FunctionModule *local_80;
  _List_node_base *local_78;
  _List_node_base *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pBVar1 = &func->bbs;
  p_Var9 = (_List_node_base *)pBVar1;
  local_80 = func;
  while (p_Var9 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                   &p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)pBVar1) {
    bVar5 = BasicBlock::isCompleted((BasicBlock *)(p_Var9 + 1));
    if (!bVar5) {
      __assert_fail("false && \"block not being terminated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0xfa,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
    }
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var9 = (pBVar1->
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)pBVar1) {
    do {
      for (p_Var10 = p_Var9[1]._M_prev; p_Var10 != (_List_node_base *)&p_Var9[1]._M_prev;
          p_Var10 = p_Var10->_M_next) {
        getDest((ir *)&local_a8,(shared_ptr<mocker::ir::IRInst> *)(p_Var10 + 1));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        {
          local_90.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_90.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)
               ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)
               ((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 8) =
                   *(_Atomic_word *)
                    ((long)local_a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 8) + 1;
            }
          }
          dycLocalReg((ir *)&local_c8,&local_90);
          if (local_90.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start == (unsigned_long *)0x0) {
            __assert_fail("reg",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                          ,0x104,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
          }
          __k = (key_type *)
                (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + 1);
          iVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&local_68,__k);
          if (iVar7.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            __assert_fail("false && \"register with multiple definitions\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                          ,0x106,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
          }
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<std::__cxx11::string_const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_68,__k);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)pBVar1);
  }
  p_Var9 = (pBVar1->
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)pBVar1) {
    do {
      p_Var10 = (_List_node_base *)&p_Var9[1]._M_prev;
      do {
        p_Var10 = p_Var10->_M_next;
        p_Var12 = p_Var10[1]._M_next;
        if (*(int *)&p_Var12->_M_prev == 0xf) {
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var12 = (_List_node_base *)0x0;
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
      } while (p_Var12 != (_List_node_base *)0x0);
      detail::dyc_impl<mocker::ir::Terminator,std::shared_ptr<mocker::ir::IRInst>const&>
                ((shared_ptr<mocker::ir::IRInst> *)&local_a8,(Terminator *)(p_Var10 + 1));
      puVar3 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var12 = p_Var10[1]._M_next;
        if (*(int *)&p_Var12->_M_prev == 0xf) {
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var12 = (_List_node_base *)0x0;
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
        if (p_Var12 != (_List_node_base *)0x0) {
          __assert_fail("false && \"misplaced phi-function\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x112,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
        }
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)pBVar1);
  }
  p_Var9 = (pBVar1->
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)pBVar1) {
    do {
      FunctionModule::getPredcessors(&local_a8,local_80,(size_t)p_Var9[1]._M_next);
      puVar4 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar8 = (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar2 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar3,puVar4);
      }
      local_70 = (_List_node_base *)&p_Var9[1]._M_prev;
      p_Var10 = p_Var9[1]._M_prev;
      local_78 = p_Var9;
      if (p_Var10 != local_70) {
        do {
          p_Var9 = p_Var10[1]._M_next;
          if (*(int *)&p_Var9->_M_prev == 0xf) {
            p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
            if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
              }
            }
          }
          else {
            p_Var9 = (_List_node_base *)0x0;
            p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (p_Var9 == (_List_node_base *)0x0) {
            if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
            }
            break;
          }
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (unsigned_long *)0x0;
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          p_Var12 = p_Var9[3]._M_next;
          for (p_Var9 = *(_List_node_base **)((long)(p_Var9 + 2) + 8);
              puVar4 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
              puVar3 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start, p_Var9 != p_Var12;
              p_Var9 = p_Var9 + 2) {
            local_90.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)((long)p_Var9[1]._M_next + 8);
            if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
            }
            else {
              *local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (unsigned_long)
                   local_90.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar8 = (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3;
            lVar2 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar3,puVar4);
          }
          puVar3 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (((long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start !=
               (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start) ||
             ((local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start &&
              (iVar6 = bcmp(local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_a8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start), iVar6 != 0)))) {
            __assert_fail("false && \"mismatched predecessors and phi-function options\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                          ,0x126,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
          }
          if (puVar3 != (unsigned_long *)0x0) {
            operator_delete(puVar3,(long)local_c8.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar3);
          }
          if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          }
          p_Var10 = p_Var10->_M_next;
        } while (p_Var10 != local_70);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var9 = local_78->_M_next;
    } while (p_Var9 != (_List_node_base *)pBVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void verifyFuncModule(const ir::FunctionModule &func) {
  // check whether all blocks are terminated
  for (const auto &bb : func.getBBs())
    if (!bb.isCompleted())
      assert(false && "block not being terminated");

  // check whether all register are only defined once
  std::unordered_set<std::string> defined;
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = getDest(inst);
      if (!dest)
        continue;
      auto reg = dycLocalReg(dest);
      assert(reg);
      if (defined.find(reg->getIdentifier()) != defined.end())
        assert(false && "register with multiple definitions");
      defined.emplace(reg->getIdentifier());
    }
  }

  // check whether there exists phi-functions that are in the middle of a block
  for (const auto &bb : func.getBBs()) {
    auto iter = bb.getInsts().begin();
    while (ir::dyc<ir::Phi>(*iter))
      ++iter;
    if (!ir::dyc<ir::Terminator>(*iter)) {
      if (ir::dyc<ir::Phi>(*iter))
        assert(false && "misplaced phi-function");
      ++iter;
    }
  }

  // check the validation of phi-functions
  for (const auto &bb : func.getBBs()) {
    auto preds = func.getPredcessors(bb.getLabelID());
    std::sort(preds.begin(), preds.end());

    for (auto &inst : bb.getInsts()) {
      auto phi = dyc<ir::Phi>(inst);
      if (!phi)
        break;

      std::vector<std::size_t> sources;
      for (auto &option : phi->getOptions())
        sources.emplace_back(option.second->getID());
      std::sort(sources.begin(), sources.end());
      if (preds != sources)
        assert(false && "mismatched predecessors and phi-function options");
    }
  }
}